

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_widget_is_mouse_clicked(nk_context *ctx,nk_buttons btn)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  nk_rect rect;
  int iVar7;
  int iVar8;
  nk_rect bounds;
  nk_rect v;
  nk_rect local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  nk_rect local_48;
  nk_rect local_38;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x49b5,"int nk_widget_is_mouse_clicked(struct nk_context *, enum nk_buttons)");
  }
  pnVar1 = ctx->current;
  if (pnVar1 != (nk_window *)0x0) {
    iVar8 = 0;
    iVar7 = 0;
    if (ctx->active == pnVar1) {
      pnVar2 = pnVar1->layout;
      uVar3 = (pnVar2->clip).x;
      uVar4 = (pnVar2->clip).y;
      uVar5 = (pnVar2->clip).w;
      uVar6 = (pnVar2->clip).h;
      local_58 = (float)(int)(float)uVar3;
      fStack_54 = (float)(int)(float)uVar4;
      fStack_50 = (float)(int)(float)uVar5;
      fStack_4c = (float)(int)(float)uVar6;
      local_48.y = fStack_54;
      local_48.x = local_58;
      local_48.h = fStack_4c;
      local_48.w = fStack_50;
      nk_layout_peek(&local_68,ctx);
      nk_unify(&local_38,&local_48,local_68.x,local_68.y,local_68.w + local_68.x,
               local_68.h + local_68.y);
      iVar7 = iVar8;
      if ((((local_68.x <= fStack_50 + local_58) && (local_58 <= local_68.x + local_68.w)) &&
          (local_68.y <= fStack_4c + fStack_54)) && (fStack_54 <= local_68.y + local_68.h)) {
        rect.y = local_68.y;
        rect.x = local_68.x;
        rect.w = local_68.w;
        rect.h = local_68.h;
        iVar7 = nk_input_mouse_clicked(&ctx->input,btn,rect);
      }
    }
    return iVar7;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x49b6,"int nk_widget_is_mouse_clicked(struct nk_context *, enum nk_buttons)");
}

Assistant:

NK_API int
nk_widget_is_mouse_clicked(struct nk_context *ctx, enum nk_buttons btn)
{
    struct nk_rect c, v;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current || ctx->active != ctx->current)
        return 0;

    c = ctx->current->layout->clip;
    c.x = (float)((int)c.x);
    c.y = (float)((int)c.y);
    c.w = (float)((int)c.w);
    c.h = (float)((int)c.h);

    nk_layout_peek(&bounds, ctx);
    nk_unify(&v, &c, bounds.x, bounds.y, bounds.x + bounds.w, bounds.y + bounds.h);
    if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds.x, bounds.y, bounds.w, bounds.h))
        return 0;
    return nk_input_mouse_clicked(&ctx->input, btn, bounds);
}